

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O2

void fec_group_init(fec_group_t *group,uchar fec_k,uchar fec_n,uchar seq,unsigned_long tstamp,
                   unsigned_short fec_len)

{
  uint __line;
  uchar *puVar1;
  uint *puVar2;
  ulong uVar3;
  char *__assertion;
  
  if (group == (fec_group_t *)0x0) {
    __assertion = "group != NULL";
    __line = 0x19;
  }
  else {
    group->fec_k = fec_k;
    group->fec_n = fec_n;
    group->seq = seq;
    group->tstamp = tstamp;
    group->fec_len = fec_len;
    group->rcvd_pkts = '\0';
    puVar1 = (uchar *)malloc((ulong)fec_len * (ulong)fec_n);
    group->buf = puVar1;
    if (puVar1 == (uchar *)0x0) {
      __assertion = "group->buf != NULL";
      __line = 0x23;
    }
    else {
      puVar2 = (uint *)malloc((ulong)((uint)fec_n * 4));
      group->lengths = puVar2;
      if (puVar2 != (uint *)0x0) {
        for (uVar3 = 0; fec_n != uVar3; uVar3 = uVar3 + 1) {
          puVar2[uVar3] = 0;
        }
        group->decoded = 0;
        return;
      }
      __assertion = "group->lengths != NULL";
      __line = 0x25;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",__line,
                "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
               );
}

Assistant:

void fec_group_init(fec_group_t *group,
                    unsigned char fec_k,
                    unsigned char fec_n,
                    unsigned char seq,
                    unsigned long tstamp,
                    unsigned short fec_len) {
  assert(group != NULL);
  
  group->fec_k = fec_k;
  group->fec_n = fec_n;
  group->seq = seq;
  group->tstamp = tstamp;
  group->fec_len = fec_len;
  group->rcvd_pkts = 0;

  group->buf = malloc(sizeof(unsigned char) * fec_n * fec_len);
  assert(group->buf != NULL);
  group->lengths = malloc(sizeof(unsigned int) * fec_n);
  assert(group->lengths != NULL);

  /* init pointers */
  int i;
  for (i = 0; i < fec_n; i++) {
    group->lengths[i] = 0;
  }

  group->decoded = 0;
}